

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

unsigned_long flatbuffers::HashFnv1<unsigned_long>(char *input)

{
  unsigned_long uVar1;
  
  uVar1 = 0xcbf29ce484222645;
  for (; (ulong)(byte)*input != 0; input = (char *)((byte *)input + 1)) {
    uVar1 = uVar1 * 0x100000001b3 ^ (ulong)(byte)*input;
  }
  return uVar1;
}

Assistant:

T HashFnv1(const char *input) {
  T hash = FnvTraits<T>::kOffsetBasis;
  for (const char *c = input; *c; ++c) {
    hash *= FnvTraits<T>::kFnvPrime;
    hash ^= static_cast<unsigned char>(*c);
  }
  return hash;
}